

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O1

float getRecordingPercentage(void)

{
  if (sec) {
    return (sec_head - sec_start) / (sec_end - sec_start);
  }
  if (frame) {
    return (float)(frame_head - frame_start) / (float)(frame_end - frame_start);
  }
  return 1.0;
}

Assistant:

float getRecordingPercentage() {
    if (sec || recordingPipe() )
        return ((sec_head - sec_start) / (sec_end - sec_start));
    else if (frame)
        return ( (float)(frame_head - frame_start) / (float)(frame_end - frame_start));
    else 
        return 1.0;
}